

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.c
# Opt level: O3

char * loader_print_info(void)

{
  return 
  "Loader Library 0.8.8\nCopyright (C) 2016 - 2025 Vicente Eduardo Ferrer Garcia <vic798@gmail.com>\nCompiled as shared library type\n\n"
  ;
}

Assistant:

const char *loader_print_info(void)
{
	static const char loader_info[] =
		"Loader Library " METACALL_VERSION "\n"
		"Copyright (C) 2016 - 2025 Vicente Eduardo Ferrer Garcia <vic798@gmail.com>\n"

#ifdef LOADER_STATIC_DEFINE
		"Compiled as static library type\n"
#else
		"Compiled as shared library type\n"
#endif

		"\n";

	return loader_info;
}